

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O2

string_t __thiscall
duckdb::URLEncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (URLEncodeOperator *this,string_t input,Vector *result)

{
  Vector *vector;
  idx_t len;
  char *output;
  char *input_00;
  string_t result_str;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  input_00 = input_local.value.pointer.prefix;
  if (0xc < (uint)this) {
    input_00 = input_local.value.pointer.ptr;
  }
  input_local.value._0_8_ = this;
  vector = (Vector *)StringUtil::URLEncodeSize(input_00,(ulong)this & 0xffffffff,true);
  result_str = StringVector::EmptyString(input.value._8_8_,vector,len);
  output = result_str.value._8_8_;
  if (result_str.value._0_4_ < 0xd) {
    output = result_str.value.pointer.prefix;
  }
  StringUtil::URLEncodeBuffer(input_00,(ulong)this & 0xffffffff,output,true);
  string_t::Finalize(&result_str);
  return (string_t)result_str.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLEncodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLEncodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}